

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

void __thiscall IR::Opnd::DumpValueType(Opnd *this)

{
  OpndKind OVar1;
  byte bVar2;
  undefined2 valueType;
  bool bVar3;
  uint uVar4;
  AddrOpnd *pAVar5;
  Var aValue;
  
  bVar3 = ValueType::IsUninitialized(&this->m_valueType);
  if (bVar3) {
    return;
  }
  if (DAT_015bc46a == '\0') {
    OVar1 = this->m_kind;
    if (OVar1 - 1 < 3) {
      return;
    }
    if (OVar1 == OpndKindAddr) {
      if ((this[2]._vptr_Opnd != (_func_int **)0x0) &&
         ((bVar2 = *(byte *)((long)&this[2].m_valueType.field_0.bits + 1), bVar2 == 10 ||
          (bVar2 == 1)))) {
        pAVar5 = AsAddrOpnd(this);
        aValue = pAVar5->decodedValue;
        if (aValue == (Var)0x0) {
          aValue = pAVar5->m_address;
        }
        if (pAVar5->addrOpndKind == AddrOpndKindConstantVar) {
          return;
        }
        bVar3 = Js::TaggedInt::Is(aValue);
        if ((ulong)aValue >> 0x32 != 0 || bVar3) {
          return;
        }
      }
    }
    else if ((((OVar1 == OpndKindReg) && (this[1]._vptr_Opnd != (_func_int **)0x0)) &&
             (uVar4 = (uint)*(byte *)((long)this[1]._vptr_Opnd + 0x1c), uVar4 < 0xb)) &&
            ((0x718U >> (uVar4 & 0x1f) & 1) != 0)) {
      return;
    }
  }
  valueType = this->m_valueType;
  DumpValueType((ValueType)valueType);
  return;
}

Assistant:

void Opnd::DumpValueType()
{
    if(m_valueType.IsUninitialized())
    {
        return;
    }

    if(!CONFIG_FLAG(Verbose))
    {
        // Skip printing the value type when it's obvious since verbose mode is off
        switch(this->GetKind())
        {
        case OpndKindIntConst:
        case OpndKindInt64Const:
        case OpndKindFloatConst:
            return;

        case OpndKindReg:
            {
                StackSym *const sym = this->AsRegOpnd()->m_sym;
                if(sym && (
                    sym->IsInt32() ||
                    sym->IsFloat32() ||
                    sym->IsFloat64() ||
                    sym->IsInt64() ||
                    sym->IsUint64()
                    ))
                {
                    return;
                }
                break;
            }

        case OpndKindAddr:
            if(this->AsAddrOpnd()->m_address && this->AsAddrOpnd()->IsVar())
            {
                IR::AddrOpnd *addrOpnd = this->AsAddrOpnd();
                Js::Var address = addrOpnd->decodedValue ? addrOpnd->decodedValue : addrOpnd->m_address;

                // Tagged int might be encoded here, so check the type
                if (addrOpnd->GetAddrOpndKind() == AddrOpndKindConstantVar
                    || Js::TaggedInt::Is(address) || (
#if !FLOATVAR
                    !JITManager::GetJITManager()->IsOOPJITEnabled() &&
#endif
                    Js::JavascriptNumber::Is_NoTaggedIntCheck(address)))
                {
                    return;
                }
            }
            break;
        }
    }

    DumpValueType(m_valueType);
}